

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

bool __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::
FindHeapObjectImpl<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,void *objectAddress,
          Recycler *recycler,FindHeapObjectFlags flags,RecyclerHeapObjectInfo *heapObject)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  ushort uVar5;
  uint uVar6;
  BOOL BVar7;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *pSVar8;
  byte *pbVar9;
  SmallHeapBlockBitVector *this_00;
  undefined8 *in_FS_OFFSET;
  uint local_34;
  
  if (((flags & FindHeapObjectFlags_AllowInterior) == FindHeapObjectFlags_NoFlags) ||
     (objectAddress = GetRealAddressFromInterior(this,objectAddress),
     (byte *)objectAddress != (byte *)0x0)) {
    uVar5 = GetAddressIndex(this,objectAddress);
    if (uVar5 != 0xffff) {
      if (((flags & FindHeapObjectFlags_NoFreeBitVerify) == FindHeapObjectFlags_NoFlags) &&
         ((((flags & FindHeapObjectFlags_VerifyFreeBitForAttribute) == FindHeapObjectFlags_NoFlags
           || (((uVar6 = (uint)(this->super_HeapBlock).heapBlockType, uVar6 < 0xb &&
                ((0x528U >> (uVar6 & 0x1f) & 1) != 0)) &&
               (pSVar8 = HeapBlock::AsFinalizableBlock<SmallAllocationBlockAttributes>
                                   (&this->super_HeapBlock), pSVar8->pendingDisposeCount != 0)))) &&
          (BVar7 = Recycler::IsConcurrentSweepExecutingState(recycler), BVar7 == 0)))) {
        if ((flags & FindHeapObjectFlags_ClearedAllocators) == FindHeapObjectFlags_NoFlags) {
          if (this->isInAllocator == true) {
            HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
            UpdateAllocators((HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                              *)this->heapBucket);
          }
        }
        else {
          bVar3 = HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                  ::AllocatorsAreEmpty
                            ((HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                              *)this->heapBucket);
          if ((!bVar3) && (recycler->isHeapEnumInProgress == false)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar1 = (undefined4 *)*in_FS_OFFSET;
            *puVar1 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                               ,0x28d,
                               "(((HeapBucketT<TBlockType> *)this->heapBucket)->AllocatorsAreEmpty() || recycler->isHeapEnumInProgress)"
                               ,
                               "((HeapBucketT<TBlockType> *)this->heapBucket)->AllocatorsAreEmpty() || recycler->isHeapEnumInProgress"
                              );
            if (!bVar3) goto LAB_002109ff;
            *puVar1 = 0;
          }
        }
        this_00 = EnsureFreeBitVector(this,true);
        local_34 = (uint)uVar5;
        BVar4 = BVStatic<256UL>::Test(this_00,(this->objectSize >> 4) * local_34);
        if (BVar4 != '\0') {
          return false;
        }
      }
      pbVar9 = ObjectInfo(this,(uint)uVar5);
      heapObject->m_address = objectAddress;
      heapObject->m_recycler = recycler;
      heapObject->m_heapBlock = &this->super_HeapBlock;
      (heapObject->field_3).m_attributes = pbVar9;
      heapObject->isUsingLargeHeapBlock = false;
      return true;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x272,"(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)",
                       "index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit");
    if (!bVar3) {
LAB_002109ff:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  return false;
}

Assistant:

bool
SmallHeapBlockT<TBlockAttributes>::FindHeapObjectImpl(void* objectAddress, Recycler * recycler, FindHeapObjectFlags flags, RecyclerHeapObjectInfo& heapObject)
{
    if (flags & FindHeapObjectFlags_AllowInterior)
    {
        objectAddress = (void*) this->GetRealAddressFromInterior(objectAddress);
        if (objectAddress == nullptr)
        {
            return false;
        }
    }

    ushort index = GetAddressIndex(objectAddress);
    Assert(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit);

    if (index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)
    {
        return false;
    }

    // If we have pending object, we still need to check the free bit if the caller requested the attribute to be correct
    bool const disableCheck = ((flags & FindHeapObjectFlags_NoFreeBitVerify) != 0) ||
        ((flags & FindHeapObjectFlags_VerifyFreeBitForAttribute) != 0 && !this->HasPendingDisposeObjects());
    if (!disableCheck)
    {
        // REVIEW: Checking if an object if free is strictly not necessary
        // In all case, we should have a valid object, For memory protect heap, this is just to make sure we don't
        // free pointers that are invalid.
#if ENABLE_CONCURRENT_GC
        if (recycler->IsConcurrentSweepExecutingState())
        {
            // TODO: unless we know the state of the heap block, we don't know.
            // skip the check for now.
        }
        else
#endif
        {
            if (flags & FindHeapObjectFlags_ClearedAllocators)
            {
                // Heap enum has some case where it allocates, so we can't assert
                Assert(((HeapBucketT<TBlockType> *)this->heapBucket)->AllocatorsAreEmpty() || recycler->isHeapEnumInProgress);
            }
            else if (this->IsInAllocator())
            {
                ((HeapBucketT<TBlockType> *)this->heapBucket)->UpdateAllocators();
            }

            // REVIEW allocation heuristics
            if (this->EnsureFreeBitVector()->Test(this->GetObjectBitDelta() * index))
            {
                return false;
            }
        }
    }

    byte& attributes = ObjectInfo(index);
    heapObject = RecyclerHeapObjectInfo(objectAddress, recycler, this, &attributes);
    return true;
}